

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O2

int32 read_dict(char *dictfile,char *fillerdict,dicthashelement_t ***dicthash)

{
  int iVar1;
  uint uVar2;
  dicthashelement_t **hashtable;
  FILE *__stream;
  lineiter_t *li;
  char *__s;
  char *pcVar3;
  dicthashelement_t *pdVar4;
  char *__s_00;
  size_t sVar5;
  char **ppcVar6;
  char *pcVar7;
  long lVar8;
  size_t d1;
  long lVar9;
  int iVar10;
  uint uVar11;
  long lStack_a0;
  char *dictfn [2];
  
  if (fillerdict == (char *)0x0) {
    lStack_a0 = 1;
  }
  else {
    lStack_a0 = 2;
    dictfn[1] = fillerdict;
  }
  dictfn[0] = dictfile;
  hashtable = (dicthashelement_t **)calloc(0x2717,0x20);
  if (hashtable == (dicthashelement_t **)0x0) {
    pcVar7 = "Unable to allocate space for dictionary\n";
    lVar8 = 0x114;
LAB_00103b68:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,lVar8,pcVar7);
  }
  else {
    lVar8 = 0;
    uVar11 = 0;
    while( true ) {
      if (lVar8 == lStack_a0) {
        *dicthash = hashtable;
        lineiter_free((lineiter_t *)0x0);
        return uVar11;
      }
      pcVar7 = dictfn[lVar8];
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x118,"Reading dict %s\n",pcVar7);
      __stream = fopen(pcVar7,"r");
      if (__stream == (FILE *)0x0) break;
      li = lineiter_start_clean((FILE *)__stream);
      uVar11 = 0;
      for (; li != (lineiter_t *)0x0; li = lineiter_next(li)) {
        if (*li->buf != '\0') {
          __s = strdup(li->buf);
          pcVar3 = strtok(__s," \t\n");
          if (pcVar3 == (char *)0x0) {
            pcVar7 = "Empty line in dictionary!\n";
            lVar8 = 0x127;
            goto LAB_00103b68;
          }
          pdVar4 = dictinstall(pcVar3,hashtable);
          if (pdVar4 == (dicthashelement_t *)0x0) {
            pcVar7 = "Unable to install dict word %s\n";
            lVar8 = 0x12a;
          }
          else if (pdVar4->nphns == 0) {
            d1 = 0;
            iVar10 = 0;
            while( true ) {
              __s_00 = strtok((char *)0x0," \t\n");
              if (__s_00 == (char *)0x0) break;
              sVar5 = strlen(__s_00);
              iVar1 = (int)sVar5;
              if (sVar5 <= (ulong)(long)iVar10) {
                iVar1 = iVar10;
              }
              d1 = d1 + 1;
              iVar10 = iVar1;
            }
            if ((int)d1 != 0) {
              pdVar4->nphns = (int)d1;
              ppcVar6 = (char **)__ckd_calloc_2d__(d1,(long)(iVar10 + 1),1,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                                  ,0x137);
              pdVar4->phones = ppcVar6;
              strtok(li->buf," \t\n");
              lVar9 = 0;
              while( true ) {
                pcVar3 = strtok((char *)0x0," \t\n");
                if (pcVar3 == (char *)0x0) break;
                strcpy(*(char **)((long)pdVar4->phones + lVar9),pcVar3);
                lVar9 = lVar9 + 8;
              }
              uVar11 = uVar11 + 1;
              free(__s);
              goto LAB_00103a8c;
            }
            pcVar7 = "Dictionary word %s has no pronunciation\n";
            lVar8 = 0x135;
          }
          else {
            pcVar7 = "Duplicate entry for %s in dictionary\n";
            lVar8 = 0x12d;
          }
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                  ,lVar8,pcVar7,pcVar3);
          goto LAB_00103b6f;
        }
        uVar2 = lineiter_lineno(li);
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                ,0x121,"Empty line %d in the dictionary file %s\n",(ulong)uVar2,pcVar7);
LAB_00103a8c:
      }
      fclose(__stream);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x142,"%d words in dict %s\n",(ulong)uVar11,pcVar7);
      lVar8 = lVar8 + 1;
    }
    err_msg_system(ERR_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                   ,0x11a,"Unable to open dictionary %s",dictfile);
  }
LAB_00103b6f:
  exit(1);
}

Assistant:

int32  read_dict(const char *dictfile, const char *fillerdict, 
		 dicthashelement_t ***dicthash)
{
    char *dictsent;
    const char *dictfn[2];
    lineiter_t *liter = NULL;
    char  *dictword, *word, *phone, *tphn;
    dicthashelement_t   **lhash, *sptr;
    int32  maxphnlen, vocabsiz=0, nphns, numdicts, idict;
    FILE   *dict;

    numdicts = 1;  dictfn[0] = dictfile;
    if (fillerdict != NULL){
        dictfn[1] = fillerdict; 
        numdicts = 2;
    }

    lhash = (dicthashelement_t**)calloc(DICTHASHSIZE,sizeof(dicthashelement_t));
    if (lhash == NULL) E_FATAL("Unable to allocate space for dictionary\n");

    /* Create hash table with dictionary words as entries */
    for (idict = 0; idict < numdicts; idict++){
	E_INFO("Reading dict %s\n",dictfn[idict]);
        if ((dict = fopen(dictfn[idict],"r")) == NULL)
            E_FATAL_SYSTEM("Unable to open dictionary %s", dictfile);

        vocabsiz = 0;
        for (liter = lineiter_start_clean(dict); liter; liter = lineiter_next(liter)) {

	    if (liter->buf[0] == 0) {
		E_WARN("Empty line %d in the dictionary file %s\n", 
			lineiter_lineno(liter), dictfn[idict]);
		continue;
	    }

	    dictsent = strdup(liter->buf);
            if ((dictword = strtok(dictsent, " \t\n")) == NULL)
                E_FATAL("Empty line in dictionary!\n");

            if ((sptr = dictinstall(dictword,lhash)) == NULL)
                E_FATAL("Unable to install dict word %s\n",dictword);

            if (sptr->nphns != 0)
                E_FATAL("Duplicate entry for %s in dictionary\n",dictword);

            /* Count number of phones in pronunciation */
	    maxphnlen = 0;
            for(nphns=0; (tphn=strtok(NULL," \t\n")) != NULL; nphns++){
	        if (strlen(tphn) > maxphnlen) maxphnlen = strlen(tphn);
            }
	    if (nphns == 0)
	        E_FATAL("Dictionary word %s has no pronunciation\n",dictword);
            sptr->nphns = nphns; maxphnlen++;
            sptr->phones = (char**)ckd_calloc_2d(nphns,maxphnlen,sizeof(char));

            word = strtok(liter->buf," \t\n");
            for(nphns=0;(phone = strtok(NULL," \t\n")) != NULL;nphns++)
	        strcpy(sptr->phones[nphns],phone);
	
            ++vocabsiz;
            
            free(dictsent);
        }
        fclose(dict);
        E_INFO("%d words in dict %s\n", vocabsiz, dictfn[idict]);
    }

    *dicthash = lhash;

    lineiter_free(liter);
    return(vocabsiz);
}